

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterogeneous_queue.hpp
# Opt level: O0

void __thiscall
libtorrent::heterogeneous_queue<libtorrent::alert>::get_pointers
          (heterogeneous_queue<libtorrent::alert> *this,
          vector<libtorrent::alert_*,_std::allocator<libtorrent::alert_*>_> *out)

{
  pointer pcVar1;
  value_type local_38;
  ushort *local_30;
  header_t *hdr;
  char *end;
  char *ptr;
  vector<libtorrent::alert_*,_std::allocator<libtorrent::alert_*>_> *out_local;
  heterogeneous_queue<libtorrent::alert> *this_local;
  
  ptr = (char *)out;
  out_local = (vector<libtorrent::alert_*,_std::allocator<libtorrent::alert_*>_> *)this;
  ::std::vector<libtorrent::alert_*,_std::allocator<libtorrent::alert_*>_>::clear(out);
  end = ::std::unique_ptr<char,_libtorrent::aux::free_deleter>::get(&this->m_storage);
  pcVar1 = ::std::unique_ptr<char,_libtorrent::aux::free_deleter>::get(&this->m_storage);
  hdr = (header_t *)(pcVar1 + this->m_size);
  for (; end < hdr; end = end + (int)(uint)*local_30) {
    local_30 = (ushort *)end;
    local_38 = (value_type)(end + (ulong)(byte)end[2] + 0x10);
    end = (char *)local_38;
    ::std::vector<libtorrent::alert_*,_std::allocator<libtorrent::alert_*>_>::push_back
              ((vector<libtorrent::alert_*,_std::allocator<libtorrent::alert_*>_> *)ptr,&local_38);
  }
  return;
}

Assistant:

void get_pointers(std::vector<T*>& out)
		{
			out.clear();

			char* ptr = m_storage.get();
			char const* const end = m_storage.get() + m_size;
			while (ptr < end)
			{
				header_t* hdr = reinterpret_cast<header_t*>(ptr);
				ptr += sizeof(header_t) + hdr->pad_bytes;
				TORRENT_ASSERT(ptr + hdr->len <= end);
				out.push_back(reinterpret_cast<T*>(ptr));
				ptr += hdr->len;
			}
		}